

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixEigenExtensions.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>_>::
ArchiveOUT(MatrixBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
           *this,ChArchiveOut *marchive)

{
  ChStreamOutAscii *this_00;
  bool bVar1;
  ChArchiveAsciiDump *this_01;
  Scalar *pSVar2;
  Index col;
  size_t i_1;
  long index;
  int i;
  long lVar3;
  ChNameValue<double> local_e0;
  double *foo;
  size_t m_col;
  size_t m_row;
  ChValueSpecific<double_*> specVal;
  char idname [21];
  ChNameValue<unsigned_long> local_60;
  ChNameValue<unsigned_long> local_48;
  
  chrono::ChArchiveOut::VersionWrite<chrono::ChMatrix_dense_version_tag>(marchive);
  this_01 = (ChArchiveAsciiDump *)
            __dynamic_cast(marchive,&chrono::ChArchiveOut::typeinfo,
                           &chrono::ChArchiveAsciiDump::typeinfo,0);
  if (this_01 == (ChArchiveAsciiDump *)0x0) {
    m_row = *(size_t *)(this + 8);
    local_48._value = &m_row;
    local_48._name = "rows";
    m_col = 1;
    local_48._flags = '\0';
    chrono::ChArchiveOut::operator<<(marchive,&local_48);
    local_60._name = "columns";
    local_60._flags = '\0';
    local_60._value = &m_col;
    chrono::ChArchiveOut::operator<<(marchive,&local_60);
    lVar3 = *(long *)(this + 8);
    foo = (double *)0x0;
    chrono::ChValueSpecific<double_*>::ChValueSpecific(&specVal,&foo,"data",'\0');
    (*(marchive->super_ChArchive)._vptr_ChArchive[0xe])(marchive,&specVal,lVar3);
    for (index = 0; lVar3 != index; index = index + 1) {
      sprintf(idname,"%lu",index);
      local_e0._value =
           DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
           ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                         *)this,index);
      local_e0._flags = '\0';
      local_e0._name = idname;
      chrono::ChArchiveOut::operator<<(marchive,&local_e0);
      (*(marchive->super_ChArchive)._vptr_ChArchive[0xf])(marchive,&specVal,lVar3);
    }
    (*(marchive->super_ChArchive)._vptr_ChArchive[0x10])(marchive,&specVal,lVar3);
    chrono::ChValue::~ChValue(&specVal.super_ChValue);
  }
  else {
    chrono::ChArchiveAsciiDump::indent(this_01);
    chrono::ChStreamOutAscii::operator<<(this_01->ostream,*(int *)(this + 8));
    chrono::ChStreamOutAscii::operator<<(this_01->ostream," rows,  ");
    chrono::ChStreamOutAscii::operator<<(this_01->ostream,1);
    chrono::ChStreamOutAscii::operator<<(this_01->ostream," columns:\n");
    for (lVar3 = 0; lVar3 < *(long *)(this + 8); lVar3 = lVar3 + 1) {
      chrono::ChArchiveAsciiDump::indent(this_01);
      bVar1 = true;
      col = 0;
      while (this_00 = this_01->ostream, bVar1) {
        pSVar2 = DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                 ::operator()((DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_1>
                               *)this,lVar3,col);
        chrono::ChStreamOutAscii::operator<<(this_00,*pSVar2);
        chrono::ChStreamOutAscii::operator<<(this_01->ostream,", ");
        bVar1 = false;
        col = 1;
      }
      chrono::ChStreamOutAscii::operator<<(this_00,"\n");
    }
  }
  return;
}

Assistant:

void ArchiveOUT(chrono::ChArchiveOut& marchive) {
    // suggested: use versioning
	marchive.VersionWrite<chrono::ChMatrix_dense_version_tag>(); // btw use the ChMatrixDynamic version tag also for all other templates.

    // stream out all member data

    if (chrono::ChArchiveAsciiDump* mascii = dynamic_cast<chrono::ChArchiveAsciiDump*>(&marchive)) {
        // CUSTOM row x col 'intuitive' table-like log when using ChArchiveAsciiDump:
        mascii->indent();
        mascii->GetStream()->operator<<((int)derived().rows());
        mascii->GetStream()->operator<<(" rows,  ");
        mascii->GetStream()->operator<<((int)derived().cols());
        mascii->GetStream()->operator<<(" columns:\n");
        for (int i = 0; i < derived().rows(); i++) {
            mascii->indent();
            for (int j = 0; j < derived().cols(); j++) {
                (*mascii->GetStream()) << derived()(i, j);
                mascii->GetStream()->operator<<(", ");
            }
            mascii->GetStream()->operator<<("\n");
        }
    } else {
        size_t m_row = derived().rows();
		size_t m_col = derived().cols();
        marchive << chrono::make_ChNameValue("rows", m_row);
        marchive << chrono::make_ChNameValue("columns", m_col);
         
        // NORMAL array-based serialization:
        size_t tot_elements = derived().rows() *  derived().cols();
		double* foo = 0;
        chrono::ChValueSpecific< double* > specVal(foo, "data", 0);
        marchive.out_array_pre(specVal, tot_elements);
		char idname[21]; // only for xml, xml serialization needs unique element name
        for (size_t i = 0; i < tot_elements; i++) {
			sprintf(idname, "%lu", (unsigned long)i);
            marchive << chrono::CHNVP(derived()((Eigen::Index)i), idname);
            marchive.out_array_between(specVal, tot_elements);
        }
        marchive.out_array_end(specVal, tot_elements);
    }
}